

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::ConvertDescriptorToTypeTest_TestCustomEnumOptions_Test::
~ConvertDescriptorToTypeTest_TestCustomEnumOptions_Test
          (ConvertDescriptorToTypeTest_TestCustomEnumOptions_Test *this)

{
  ConvertDescriptorToTypeTest_TestCustomEnumOptions_Test *this_local;
  
  ~ConvertDescriptorToTypeTest_TestCustomEnumOptions_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ConvertDescriptorToTypeTest, TestCustomEnumOptions) {
  Enum type = ConvertDescriptorToType(
      *proto2_unittest::TestMessageWithCustomOptions::AnEnum_descriptor());
  ASSERT_TRUE(
      HasInt32Option(type.options(), "proto2_unittest.enum_opt1", -789));
  const EnumValue* value = FindEnumValue(type, "ANENUM_VAL2");
  ASSERT_TRUE(value != nullptr);
  ASSERT_TRUE(
      HasInt32Option(value->options(), "proto2_unittest.enum_value_opt1", 123));
}